

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall testing::Matcher<const_char_&>::Matcher(Matcher<const_char_&> *this,char *value)

{
  MatcherBase<const_char_&> local_28;
  
  (this->super_MatcherBase<const_char_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_char_&>).buffer_.ptr = (void *)0x0;
  (this->super_MatcherBase<const_char_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_0016c160;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<char_const&>::
       GetVTable<testing::internal::MatcherBase<char_const&>::ValuePolicy<testing::internal::EqMatcher<char>,true>>()
       ::kVTable;
  local_28.buffer_.i._1_7_ = 0;
  local_28.buffer_.i._0_1_ = *value;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0016c160;
  internal::MatcherBase<const_char_&>::operator=(&this->super_MatcherBase<const_char_&>,&local_28);
  internal::MatcherBase<const_char_&>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}